

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTcFormalTypeList::add_typed_param(CTcFormalTypeList *this,CTcToken *tok)

{
  CTcFormalTypeEle *this_00;
  CTcFormalTypeList *pCVar1;
  
  this_00 = (CTcFormalTypeEle *)CTcPrsMem::alloc(G_prsmem,0x18);
  CTcFormalTypeEle::CTcFormalTypeEle(this_00,tok->text_,tok->text_len_);
  pCVar1 = (CTcFormalTypeList *)this->tail_;
  if ((CTcFormalTypeList *)this->tail_ == (CTcFormalTypeList *)0x0) {
    pCVar1 = this;
  }
  pCVar1->head_ = this_00;
  this->tail_ = this_00;
  this_00->nxt_ = (CTcFormalTypeEle *)0x0;
  return;
}

Assistant:

void CTcFormalTypeList::add_typed_param(const CTcToken *tok)
{
    add(new (G_prsmem) CTcFormalTypeEle(tok->get_text(), tok->get_text_len()));
}